

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::collapse_selected_element(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *pHVar2;
  XFormWidget *pXVar3;
  long lVar4;
  long lVar5;
  VertexIter VVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pSVar1 = (this->super_SceneObject).scene;
  if ((pSVar1 != (Scene *)0x0) &&
     (pHVar2 = (pSVar1->selected).element, pHVar2 != (HalfedgeElement *)0x0)) {
    lVar4 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Edge::typeinfo,0,in_R8,in_R9,pSVar1);
    lVar5 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Face::typeinfo,0);
    if (lVar4 == 0) {
      if (lVar5 == 0) {
        return;
      }
      VVar6 = HalfedgeMesh::collapseFace
                        (&this->mesh,*(_List_node_base **)(*(long *)(lVar5 + 0xa8) + 0x38));
    }
    else {
      VVar6 = HalfedgeMesh::collapseEdge
                        (&this->mesh,*(_List_node_base **)(*(long *)(lVar4 + 0x58) + 0x30));
    }
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).element = (HalfedgeElement *)(VVar6._M_node + 1);
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).axis = None;
    pXVar3 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar3->target).coordinates.z = 0.0;
    (pXVar3->target).coordinates.x = 0.0;
    (pXVar3->target).coordinates.y = 0.0;
    (pXVar3->target).object = (SceneObject *)0x0;
    (pXVar3->target).element = (HalfedgeElement *)0x0;
    (pXVar3->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::collapse_selected_element() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   Face *face = element->getFace();
   VertexIter v;

   if (edge != nullptr)
   {
      v = mesh.collapseEdge(edge->halfedge()->edge());
   }
   else if( face != nullptr )
   {
      v = mesh.collapseFace(face->halfedge()->face());
   }
   else
   {
      return;
   }

   scene->selected.element = elementAddress( v );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}